

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O3

bool __thiscall
QGenericItemModel::moveRows
          (QGenericItemModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationRow)

{
  long in_FS_OFFSET;
  bool ret;
  int local_4c;
  int local_48;
  int local_44;
  int *local_40;
  QModelIndex *local_38;
  int *local_30;
  int *local_28;
  QModelIndex *local_20;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &local_44;
  local_30 = &local_48;
  local_40 = &local_4c;
  local_11 = 0;
  local_4c = destinationRow;
  local_48 = count;
  local_44 = sourceRow;
  local_38 = destinationParent;
  local_20 = sourceParent;
  (**(code **)(*(long *)(this + 0x10) + 8))(9,*(long *)(this + 0x10),&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count,
                                 const QModelIndex &destinationParent, int destinationRow)
{
    return impl->call<bool>(QGenericItemModelImplBase::MoveRows,
                            sourceParent, sourceRow, count,
                            destinationParent, destinationRow);
}